

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_16x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  int y_mask;
  uint uVar21;
  short sVar22;
  short sVar23;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar24 [16];
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar43;
  ushort uVar45;
  ushort uVar47;
  ushort uVar49;
  ushort uVar51;
  ushort uVar53;
  undefined1 auVar41 [16];
  ushort uVar44;
  ushort uVar46;
  ushort uVar48;
  ushort uVar50;
  ushort uVar52;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar42 [16];
  ushort uVar57;
  ushort uVar58;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  undefined1 auVar59 [16];
  ushort uVar72;
  ushort uVar73;
  
  auVar24 = pshuflw(ZEXT116(top_row[0xf]),ZEXT116(top_row[0xf]),0);
  sVar22 = auVar24._0_2_;
  sVar31 = auVar24._2_2_;
  uVar1 = *(ulong *)left_column;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[10] = (char)(uVar1 >> 0x28);
  auVar7._11_4_ = auVar5._11_4_;
  auVar9._8_2_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = (char)(uVar1 >> 0x20);
  auVar11._0_8_ = uVar1;
  auVar11._9_6_ = auVar9._9_6_;
  auVar15._7_8_ = 0;
  auVar15._0_7_ = auVar11._8_7_;
  auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
  auVar17[0] = (char)(uVar1 >> 0x18);
  auVar17._9_6_ = 0;
  auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
  auVar18[0] = (char)(uVar1 >> 0x10);
  auVar18._11_4_ = 0;
  auVar14[2] = (char)(uVar1 >> 8);
  auVar14._0_2_ = (ushort)uVar1;
  auVar14._3_12_ = SUB1512(auVar18 << 0x20,3);
  auVar24._0_2_ = (ushort)uVar1 & 0xff;
  auVar24._2_13_ = auVar14._2_13_;
  auVar24[0xf] = 0;
  sVar32 = sVar31 * 0x1f + 0x80;
  sVar33 = sVar22 * 0x3c + 0x80;
  sVar34 = sVar31 * 0x56 + 0x80;
  sVar35 = sVar22 * 0x6f + 0x80;
  sVar36 = sVar31 * 0x85 + 0x80;
  sVar37 = sVar22 * 0x9a + 0x80;
  sVar38 = sVar31 * 0xac + 0x80;
  sVar23 = sVar22 * 0xbc + 0x80;
  sVar25 = sVar31 * 0xca + 0x80;
  sVar26 = sVar22 * 0xd5 + 0x80;
  sVar27 = sVar31 * 0xdf + 0x80;
  sVar28 = sVar22 * 0xe6 + 0x80;
  sVar29 = sVar31 * 0xec + 0x80;
  sVar30 = sVar22 * 0xef + 0x80;
  sVar31 = sVar31 * 0xf0 + 0x80;
  for (uVar21 = 0x1000100; uVar21 < 0xf0e0f0f; uVar21 = uVar21 + 0x2020202) {
    auVar41._4_4_ = uVar21;
    auVar41._0_4_ = uVar21;
    auVar41._8_4_ = uVar21;
    auVar41._12_4_ = uVar21;
    auVar59 = pshufb(auVar24,auVar41);
    uVar39 = auVar59._0_2_ * 0xff + sVar22 + 0x80;
    uVar43 = auVar59._2_2_ * 0xe1 + sVar32;
    uVar45 = auVar59._4_2_ * 0xc4 + sVar33;
    uVar47 = auVar59._6_2_ * 0xaa + sVar34;
    uVar49 = auVar59._8_2_ * 0x91 + sVar35;
    uVar51 = auVar59._10_2_ * 0x7b + sVar36;
    uVar53 = auVar59._12_2_ * 0x66 + sVar37;
    uVar55 = auVar59._14_2_ * 0x54 + sVar38;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar46 = uVar45 >> 8;
    uVar48 = uVar47 >> 8;
    uVar50 = uVar49 >> 8;
    uVar52 = uVar51 >> 8;
    uVar54 = uVar53 >> 8;
    uVar56 = uVar55 >> 8;
    uVar57 = auVar59._0_2_ * 0x44 + sVar23;
    uVar60 = auVar59._2_2_ * 0x36 + sVar25;
    uVar62 = auVar59._4_2_ * 0x2b + sVar26;
    uVar64 = auVar59._6_2_ * 0x21 + sVar27;
    uVar66 = auVar59._8_2_ * 0x1a + sVar28;
    uVar68 = auVar59._10_2_ * 0x14 + sVar29;
    uVar70 = auVar59._12_2_ * 0x11 + sVar30;
    uVar72 = auVar59._14_2_ * 0x10 + sVar31;
    uVar58 = uVar57 >> 8;
    uVar61 = uVar60 >> 8;
    uVar63 = uVar62 >> 8;
    uVar65 = uVar64 >> 8;
    uVar67 = uVar66 >> 8;
    uVar69 = uVar68 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    *dst = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst[1] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
    dst[2] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
    dst[3] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
    dst[4] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
    dst[5] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    dst[6] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
    dst[7] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[8] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    dst[10] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
    dst[0xb] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
    dst[0xc] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
    dst[0xd] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    dst[0xe] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    dst[0xf] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    dst = dst + stride;
  }
  uVar1 = *(ulong *)(left_column + 8);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = (char)(uVar1 >> 0x38);
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xc] = (char)(uVar1 >> 0x30);
  auVar6._13_2_ = auVar4._13_2_;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[10] = (char)(uVar1 >> 0x28);
  auVar10._11_4_ = auVar8._11_4_;
  auVar12._8_2_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._10_5_ = auVar10._10_5_;
  auVar13[8] = (char)(uVar1 >> 0x20);
  auVar13._0_8_ = uVar1;
  auVar13._9_6_ = auVar12._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar13._8_7_;
  auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
  auVar19[0] = (char)(uVar1 >> 0x18);
  auVar19._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar20[0] = (char)(uVar1 >> 0x10);
  auVar20._11_4_ = 0;
  auVar59._3_12_ = SUB1512(auVar20 << 0x20,3);
  auVar59[2] = (char)(uVar1 >> 8);
  auVar59[0] = (byte)uVar1;
  auVar59[1] = 0;
  auVar59[0xf] = 0;
  for (uVar21 = 0x1000100; uVar21 < 0xf0e0f0f; uVar21 = uVar21 + 0x2020202) {
    auVar42._4_4_ = uVar21;
    auVar42._0_4_ = uVar21;
    auVar42._8_4_ = uVar21;
    auVar42._12_4_ = uVar21;
    auVar24 = pshufb(auVar59,auVar42);
    uVar39 = auVar24._0_2_ * 0xff + sVar22 + 0x80;
    uVar43 = auVar24._2_2_ * 0xe1 + sVar32;
    uVar45 = auVar24._4_2_ * 0xc4 + sVar33;
    uVar47 = auVar24._6_2_ * 0xaa + sVar34;
    uVar49 = auVar24._8_2_ * 0x91 + sVar35;
    uVar51 = auVar24._10_2_ * 0x7b + sVar36;
    uVar53 = auVar24._12_2_ * 0x66 + sVar37;
    uVar55 = auVar24._14_2_ * 0x54 + sVar38;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar46 = uVar45 >> 8;
    uVar48 = uVar47 >> 8;
    uVar50 = uVar49 >> 8;
    uVar52 = uVar51 >> 8;
    uVar54 = uVar53 >> 8;
    uVar56 = uVar55 >> 8;
    uVar57 = auVar24._0_2_ * 0x44 + sVar23;
    uVar60 = auVar24._2_2_ * 0x36 + sVar25;
    uVar62 = auVar24._4_2_ * 0x2b + sVar26;
    uVar64 = auVar24._6_2_ * 0x21 + sVar27;
    uVar66 = auVar24._8_2_ * 0x1a + sVar28;
    uVar68 = auVar24._10_2_ * 0x14 + sVar29;
    uVar70 = auVar24._12_2_ * 0x11 + sVar30;
    uVar72 = auVar24._14_2_ * 0x10 + sVar31;
    uVar58 = uVar57 >> 8;
    uVar61 = uVar60 >> 8;
    uVar63 = uVar62 >> 8;
    uVar65 = uVar64 >> 8;
    uVar67 = uVar66 >> 8;
    uVar69 = uVar68 >> 8;
    uVar71 = uVar70 >> 8;
    uVar73 = uVar72 >> 8;
    *dst = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst[1] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
    dst[2] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
    dst[3] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
    dst[4] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
    dst[5] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    dst[6] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
    dst[7] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[8] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
    dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    dst[10] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
    dst[0xb] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
    dst[0xc] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
    dst[0xd] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
    dst[0xe] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
    dst[0xf] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_16x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
}